

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O0

int __thiscall pstore::romfs::romfs::open(romfs *this,char *__file,int __oflag,...)

{
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> local_40;
  char *local_20;
  romfs *this_local;
  not_null<const_char_*> path_local;
  
  local_20 = __file;
  this_local = (romfs *)___oflag;
  path_local.ptr_ = (char *)this;
  parse_path(&local_40,(romfs *)__file,___oflag);
  operator>>=(this,&local_40);
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::~error_or(&local_40);
  return (int)this;
}

Assistant:

auto romfs::open (not_null<czstring> const path) const -> error_or<descriptor> {
            return this->parse_path (path) >>= [] (dirent_ptr const de) {
                auto const file = std::make_shared<open_file> (*de);
                return error_or<descriptor>{descriptor{file}};
            };
        }